

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_model(Net *this,DataReader *dr)

{
  pointer ppLVar1;
  pointer ppLVar2;
  Layer *pLVar3;
  int iVar4;
  PoolAllocator *pPVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int local_8c;
  ModelBinFromDataReader mb;
  Option opt1;
  
  ppLVar1 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppLVar1 == ppLVar2) {
    fwrite("network graph not ready",0x17,1,_stderr);
    fputc(10,_stderr);
    local_8c = -1;
  }
  else {
    uVar6 = (ulong)((long)ppLVar2 - (long)ppLVar1) >> 3;
    ModelBinFromDataReader::ModelBinFromDataReader(&mb,dr);
    uVar8 = 0;
    uVar7 = uVar6 & 0xffffffff;
    if ((int)uVar6 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8];
      if (pLVar3 == (Layer *)0x0) {
        fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.",
                uVar8 & 0xffffffff);
LAB_00146b26:
        local_8c = -1;
        fputc(10,_stderr);
        goto LAB_00146985;
      }
      iVar4 = (*pLVar3->_vptr_Layer[3])(pLVar3,&mb);
      if (iVar4 != 0) {
        fprintf(_stderr,"layer load_model %d %s failed",uVar8 & 0xffffffff,
                (pLVar3->name)._M_dataplus._M_p);
        goto LAB_00146b26;
      }
      if (pLVar3->support_int8_storage == true) {
        (this->opt).use_vulkan_compute = false;
      }
    }
    local_8c = 0;
LAB_00146985:
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pLVar3 = (this->d->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar6];
      opt1.lightmode = (this->opt).lightmode;
      opt1._1_3_ = *(undefined3 *)&(this->opt).field_0x1;
      opt1.num_threads = (this->opt).num_threads;
      opt1.blob_allocator._0_4_ = *(undefined4 *)&(this->opt).blob_allocator;
      opt1.blob_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).blob_allocator + 4);
      opt1.workspace_allocator._0_4_ = *(undefined4 *)&(this->opt).workspace_allocator;
      opt1.workspace_allocator._4_4_ = *(undefined4 *)((long)&(this->opt).workspace_allocator + 4);
      opt1.openmp_blocktime = (this->opt).openmp_blocktime;
      opt1.use_winograd_convolution = (this->opt).use_winograd_convolution;
      opt1.use_sgemm_convolution = (this->opt).use_sgemm_convolution;
      opt1.use_int8_inference = (this->opt).use_int8_inference;
      opt1.use_vulkan_compute = (this->opt).use_vulkan_compute;
      opt1.use_bf16_storage = (this->opt).use_bf16_storage;
      opt1.use_fp16_packed = (this->opt).use_fp16_packed;
      opt1.use_fp16_storage = (this->opt).use_fp16_storage;
      opt1.use_fp16_arithmetic = (this->opt).use_fp16_arithmetic;
      opt1.use_int8_packed = (this->opt).use_int8_packed;
      opt1.use_int8_storage = (this->opt).use_int8_storage;
      opt1.use_int8_arithmetic = (this->opt).use_int8_arithmetic;
      opt1.use_packing_layout = (this->opt).use_packing_layout;
      opt1.use_shader_pack8 = (this->opt).use_shader_pack8;
      opt1.use_subgroup_basic = (this->opt).use_subgroup_basic;
      opt1.use_subgroup_vote = (this->opt).use_subgroup_vote;
      opt1.use_subgroup_ballot = (this->opt).use_subgroup_ballot;
      opt1.use_subgroup_shuffle = (this->opt).use_subgroup_shuffle;
      opt1.use_image_storage = (this->opt).use_image_storage;
      opt1.use_tensor_storage = (this->opt).use_tensor_storage;
      opt1.use_weight_fp16_storage = (this->opt).use_weight_fp16_storage;
      opt1.flush_denormals = (this->opt).flush_denormals;
      opt1.use_local_pool_allocator = (this->opt).use_local_pool_allocator;
      opt1.use_reserved_1 = (this->opt).use_reserved_1;
      opt1.use_reserved_2 = (this->opt).use_reserved_2;
      opt1.use_reserved_3 = (this->opt).use_reserved_3;
      opt1.use_reserved_4 = (this->opt).use_reserved_4;
      opt1.use_reserved_5 = (this->opt).use_reserved_5;
      opt1.use_reserved_6 = (this->opt).use_reserved_6;
      opt1.use_reserved_7 = (this->opt).use_reserved_7;
      opt1.use_reserved_8 = (this->opt).use_reserved_8;
      opt1.use_reserved_9 = (this->opt).use_reserved_9;
      opt1.use_reserved_10 = (this->opt).use_reserved_10;
      opt1.use_reserved_11 = (this->opt).use_reserved_11;
      iVar4 = (*pLVar3->_vptr_Layer[4])(pLVar3,&opt1);
      if (iVar4 != 0) {
        fprintf(_stderr,"layer create_pipeline %d %s failed",uVar6 & 0xffffffff,
                (pLVar3->name)._M_dataplus._M_p);
        fputc(10,_stderr);
        local_8c = -1;
        break;
      }
    }
    if ((this->opt).use_local_pool_allocator == true) {
      if (((this->opt).blob_allocator == (Allocator *)0x0) &&
         (this->d->local_blob_allocator == (PoolAllocator *)0x0)) {
        pPVar5 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar5);
        this->d->local_blob_allocator = pPVar5;
        PoolAllocator::set_size_compare_ratio(pPVar5,0.0);
      }
      if (((this->opt).workspace_allocator == (Allocator *)0x0) &&
         (this->d->local_workspace_allocator == (PoolAllocator *)0x0)) {
        pPVar5 = (PoolAllocator *)operator_new(0x10);
        PoolAllocator::PoolAllocator(pPVar5);
        this->d->local_workspace_allocator = pPVar5;
        PoolAllocator::set_size_compare_ratio(pPVar5,0.5);
      }
    }
    ModelBinFromDataReader::~ModelBinFromDataReader(&mb);
  }
  return local_8c;
}

Assistant:

int Net::load_model(const DataReader& dr)
{
    if (d->layers.empty())
    {
        NCNN_LOGE("network graph not ready");
        return -1;
    }

    int layer_count = (int)d->layers.size();

    // load file
    int ret = 0;

    ModelBinFromDataReader mb(dr);
    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        //Here we found inconsistent content in the parameter file.
        if (!layer)
        {
            NCNN_LOGE("load_model error at layer %d, parameter file has inconsistent content.", i);
            ret = -1;
            break;
        }

        int lret = layer->load_model(mb);
        if (lret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer load_model %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer load_model %d failed", i);
#endif
            ret = -1;
            break;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!opt.pipeline_cache)
        {
            if (!d->pipeline_cache)
                d->pipeline_cache = new PipelineCache(d->vkdev);
            opt.pipeline_cache = d->pipeline_cache;
        }
    }
#endif // NCNN_VULKAN

    for (int i = 0; i < layer_count; i++)
    {
        Layer* layer = d->layers[i];

        Option opt1 = opt;
#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
        {
            if (!layer->support_image_storage) opt1.use_image_storage = false;
        }
#endif // NCNN_VULKAN

        int cret = layer->create_pipeline(opt1);
        if (cret != 0)
        {
#if NCNN_STRING
            NCNN_LOGE("layer create_pipeline %d %s failed", i, layer->name.c_str());
#else
            NCNN_LOGE("layer create_pipeline %d failed", i);
#endif
            ret = -1;
            break;
        }
    }

    if (opt.use_local_pool_allocator)
    {
        if (opt.blob_allocator == 0)
        {
            if (!d->local_blob_allocator)
            {
                d->local_blob_allocator = new PoolAllocator;
                d->local_blob_allocator->set_size_compare_ratio(0.f);
            }
        }
        if (opt.workspace_allocator == 0)
        {
            if (!d->local_workspace_allocator)
            {
                d->local_workspace_allocator = new PoolAllocator;
                d->local_workspace_allocator->set_size_compare_ratio(0.5f);
            }
        }
    }

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        d->upload_model();
    }
#endif // NCNN_VULKAN

    return ret;
}